

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_split_firstCharDelimiter_fn(int _i)

{
  int iVar1;
  ASplittedString *splitted;
  char *pcVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x150dc9;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,";0123456",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x150e09;
  splitted = AString_split(&string,';',false);
  if (string.capacity != 8) {
    local_60 = "(8)";
    pcVar6 = "(string).capacity == (8)";
    pcVar7 = "(string).capacity";
    pcVar2 = (char *)string.capacity;
LAB_001511f1:
    iVar1 = 0xa08;
LAB_00151582:
    local_58 = (char *)0x8;
LAB_00151588:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar5 = &local_60;
    goto LAB_0015158a;
  }
  uStack_50 = 0x150e2a;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa08);
  if (string.buffer == (char *)0x0) {
    ppcVar4 = &local_58;
    pcVar7 = "Assertion \'_ck_x != NULL\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %#x";
    pcVar6 = "(void*) (string).buffer != NULL";
    pcVar8 = "(void*) (string).buffer";
    iVar1 = 0xa08;
    goto LAB_001514ee;
  }
  uStack_50 = 0x150e47;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa08);
  pcVar8 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar2 = "";
    pcVar8 = "(null)";
LAB_00151185:
    local_60 = ";0123456";
    pcStack_70 = "(\";0123456\")";
    pcVar6 = "(string).buffer == (\";0123456\")";
    pcVar7 = "(void*) (string).buffer";
    iVar1 = 0xa08;
  }
  else {
    uStack_50 = 0x150e67;
    iVar1 = strcmp(";0123456",string.buffer);
    if (iVar1 != 0) {
      pcVar2 = "\"";
      goto LAB_00151185;
    }
    uStack_50 = 0x150e80;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa08);
    if (string.size != 8) {
      local_60 = "strlen(\";0123456\")";
      pcVar6 = "(string).size == strlen(\";0123456\")";
      pcVar7 = "(string).size";
      pcVar2 = (char *)string.size;
      goto LAB_001511f1;
    }
    uStack_50 = 0x150ea0;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa08);
    if (splitted == (ASplittedString *)0x0) {
      ppcVar4 = &local_58;
      pcVar7 = "Assertion \'_ck_x != NULL\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %#x";
      pcVar6 = "(void*) splitted != NULL";
      pcVar8 = "(void*) splitted";
      iVar1 = 0xa09;
      goto LAB_001514ee;
    }
    uStack_50 = 0x150eba;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa09);
    uStack_50 = 0x150ec2;
    pcVar2 = (char *)private_ACUtils_ADynArray_size(splitted);
    if (pcVar2 != (char *)0x2) {
      local_60 = "2";
      pcVar6 = "private_ACUtils_ADynArray_size(splitted) == 2";
      pcVar7 = "private_ACUtils_ADynArray_size(splitted)";
      iVar1 = 0xa0a;
      local_58 = (char *)0x2;
      goto LAB_00151588;
    }
    uStack_50 = 0x150edd;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa0a);
    pcVar2 = (char *)(*splitted->buffer)->capacity;
    if (pcVar2 != (char *)0x8) {
      local_60 = "(8)";
      pcVar6 = "(*(splitted->buffer[0])).capacity == (8)";
      pcVar7 = "(*(splitted->buffer[0])).capacity";
      iVar1 = 0xa0b;
      goto LAB_00151582;
    }
    uStack_50 = 0x150f03;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa0b);
    if ((*splitted->buffer)->buffer == (char *)0x0) {
      ppcVar4 = &local_58;
      pcVar7 = "Assertion \'_ck_x != NULL\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %#x";
      pcVar6 = "(void*) (*(splitted->buffer[0])).buffer != NULL";
      pcVar8 = "(void*) (*(splitted->buffer[0])).buffer";
LAB_00151374:
      iVar1 = 0xa0b;
LAB_001514ee:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(undefined8 *)((long)ppcVar4 + -8) = 0x1514f5;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar1,pcVar7,pcVar2,pcVar6,pcVar8);
    }
    uStack_50 = 0x150f26;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa0b);
    pcVar2 = (*splitted->buffer)->buffer;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "(null)";
      pcStack_78 = "";
LAB_001512ea:
      uStack_50 = 0;
      local_58 = "\"";
      local_60 = "";
      local_68 = "\"";
      pcStack_70 = "(\"\")";
      pcStack_80 = pcVar2;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa0b,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(*(splitted->buffer[0])).buffer == (\"\")",
                        "(*(splitted->buffer[0])).buffer",pcStack_78);
    }
    if (*pcVar2 != '\0') {
      pcStack_78 = "\"";
      goto LAB_001512ea;
    }
    uStack_50 = 0x150f5c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa0b);
    pcVar3 = (char *)(*splitted->buffer)->size;
    if (pcVar3 != (char *)0x0) {
      ppcVar4 = &local_68;
      local_60 = "strlen(\"\")";
      pcVar7 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar6 = "(*(splitted->buffer[0])).size == strlen(\"\")";
      pcVar8 = "(*(splitted->buffer[0])).size";
      local_68 = pcVar3;
      goto LAB_00151374;
    }
    uStack_50 = 0x150f81;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa0b);
    pcVar2 = (char *)splitted->buffer[1]->capacity;
    if (pcVar2 != (char *)0x8) {
      local_60 = "(8)";
      pcVar6 = "(*(splitted->buffer[1])).capacity == (8)";
      pcVar7 = "(*(splitted->buffer[1])).capacity";
      iVar1 = 0xa0c;
      goto LAB_00151582;
    }
    uStack_50 = 0x150fa8;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa0c);
    if (splitted->buffer[1]->buffer == (char *)0x0) {
      ppcVar4 = &local_58;
      pcVar7 = "Assertion \'_ck_x != NULL\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %#x";
      pcVar6 = "(void*) (*(splitted->buffer[1])).buffer != NULL";
      pcVar8 = "(void*) (*(splitted->buffer[1])).buffer";
      iVar1 = 0xa0c;
      goto LAB_001514ee;
    }
    uStack_50 = 0x150fcc;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa0c);
    pcVar8 = splitted->buffer[1]->buffer;
    if (pcVar8 == (char *)0x0) {
      pcVar2 = "";
      pcVar8 = "(null)";
    }
    else {
      uStack_50 = 0x150ff0;
      iVar1 = strcmp("0123456",pcVar8);
      if (iVar1 == 0) {
        uStack_50 = 0x151009;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0xa0c);
        pcVar2 = (char *)splitted->buffer[1]->size;
        if (pcVar2 != (char *)0x7) {
          local_60 = "strlen(\"0123456\")";
          pcVar6 = "(*(splitted->buffer[1])).size == strlen(\"0123456\")";
          pcVar7 = "(*(splitted->buffer[1])).size";
          iVar1 = 0xa0c;
          local_58 = (char *)0x7;
          goto LAB_00151588;
        }
        uStack_50 = 0x151030;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0xa0c);
        uStack_50 = 0x151038;
        AString_freeSplitted(splitted);
        if (string.capacity == 8) {
          uStack_50 = 0x151058;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa0e);
          if (string.buffer == (char *)0x0) {
            ppcVar4 = &local_58;
            pcVar7 = "Assertion \'_ck_x != NULL\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %#x";
            pcVar6 = "(void*) (string).buffer != NULL";
            pcVar8 = "(void*) (string).buffer";
            iVar1 = 0xa0e;
            goto LAB_001514ee;
          }
          uStack_50 = 0x151075;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa0e);
          pcVar8 = string.buffer;
          if (string.buffer == (char *)0x0) {
            pcVar8 = "(null)";
            pcVar2 = "";
          }
          else {
            uStack_50 = 0x151092;
            iVar1 = strcmp(";0123456",string.buffer);
            if (iVar1 == 0) {
              uStack_50 = 0x1510ab;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa0e);
              if (string.size == 8) {
                uStack_50 = 0x1510cb;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa0e);
                local_58 = (char *)private_ACUtilsTest_AString_freeCount;
                if (private_ACUtilsTest_AString_reallocCount ==
                    private_ACUtilsTest_AString_freeCount) {
                  uStack_50 = 0x1510f3;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0xa0f);
                  uStack_50 = 0x1510fc;
                  (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))
                            (string.buffer);
                  return;
                }
                expr = "Assertion \'_ck_x == _ck_y\' failed";
                pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                pcVar6 = 
                "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)"
                ;
                pcVar7 = "private_ACUtilsTest_AString_reallocCount";
                iVar1 = 0xa0f;
                ppcVar5 = &local_60;
                local_60 = "(private_ACUtilsTest_AString_freeCount)";
                pcVar2 = (char *)private_ACUtilsTest_AString_reallocCount;
                goto LAB_0015158a;
              }
              local_60 = "strlen(\";0123456\")";
              pcVar6 = "(string).size == strlen(\";0123456\")";
              pcVar7 = "(string).size";
              pcVar2 = (char *)string.size;
              goto LAB_0015157d;
            }
            pcVar2 = "\"";
          }
          expr = 
          "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
          ;
          pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
          pcVar6 = "(string).buffer == (\";0123456\")";
          pcVar7 = "(string).buffer";
          iVar1 = 0xa0e;
          local_58 = "\"";
          local_60 = ";0123456";
          local_68 = "\"";
          pcStack_70 = "(\";0123456\")";
          ppcVar5 = &pcStack_80;
          pcStack_80 = pcVar8;
          pcStack_78 = pcVar2;
          goto LAB_0015158a;
        }
        local_60 = "(8)";
        pcVar6 = "(string).capacity == (8)";
        pcVar7 = "(string).capacity";
        pcVar2 = (char *)string.capacity;
LAB_0015157d:
        iVar1 = 0xa0e;
        goto LAB_00151582;
      }
      pcVar2 = "\"";
    }
    local_60 = "0123456";
    pcStack_70 = "(\"0123456\")";
    pcVar6 = "(*(splitted->buffer[1])).buffer == (\"0123456\")";
    pcVar7 = "(void*) (*(splitted->buffer[1])).buffer";
    iVar1 = 0xa0c;
  }
  pcVar7 = pcVar7 + 8;
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_68 = "\"";
  ppcVar5 = &pcStack_80;
  pcStack_80 = pcVar8;
  pcStack_78 = pcVar2;
LAB_0015158a:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar2;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x151591;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_split_firstCharDelimiter)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString(";0123456", 8);
    struct ASplittedString *splitted;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    splitted = AString_split(&string, ';', false);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";0123456", 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(splitted);
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_size(splitted), 2);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 0), "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 1), "0123456", 8);
    AString_freeSplitted(splitted);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";0123456", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(private_ACUtilsTest_AString_freeCount);
    private_ACUtilsTest_AString_destructTestString(string);
}